

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_label.c
# Opt level: O2

HPDF_Dict HPDF_PageLabel_New(HPDF_Doc pdf,HPDF_PageNumStyle style,HPDF_INT first_page,char *prefix)

{
  HPDF_Dict dict;
  HPDF_STATUS HVar1;
  HPDF_String obj;
  char *value;
  
  dict = HPDF_Dict_New(pdf->mmgr);
  if (dict == (HPDF_Dict)0x0) {
    return (HPDF_Dict)0x0;
  }
  switch((ulong)style) {
  case 0:
    value = "D";
    break;
  case 1:
    value = "R";
    break;
  case 2:
    value = "r";
    break;
  case 3:
    value = "A";
    break;
  case 4:
    value = "a";
    break;
  default:
    HPDF_SetError(&pdf->error,0x1071,(ulong)style);
    goto LAB_00129cd2;
  }
  HVar1 = HPDF_Dict_AddName(dict,"S",value);
  if (HVar1 == 0) {
    if ((prefix != (char *)0x0) && (*prefix != '\0')) {
      obj = HPDF_String_New(pdf->mmgr,prefix,pdf->def_encoder);
      HVar1 = HPDF_Dict_Add(dict,"P",obj);
      if (HVar1 != 0) goto LAB_00129cd2;
    }
    if (first_page == 0) {
      return dict;
    }
    HVar1 = HPDF_Dict_AddNumber(dict,"St",first_page);
    if (HVar1 == 0) {
      return dict;
    }
  }
LAB_00129cd2:
  HPDF_Dict_Free(dict);
  return (HPDF_Dict)0x0;
}

Assistant:

HPDF_Dict
HPDF_PageLabel_New  (HPDF_Doc             pdf,
                     HPDF_PageNumStyle    style,
                     HPDF_INT             first_page,
                     const char     *prefix)
{
    HPDF_Dict obj = HPDF_Dict_New (pdf->mmgr);

    HPDF_PTRACE ((" HPDF_PageLabel_New\n"));

    if (!obj)
        return NULL;

    switch (style) {
        case HPDF_PAGE_NUM_STYLE_DECIMAL:
            if (HPDF_Dict_AddName (obj, "S", "D") != HPDF_OK)
                goto Fail;
            break;
        case HPDF_PAGE_NUM_STYLE_UPPER_ROMAN:
            if (HPDF_Dict_AddName (obj, "S", "R") != HPDF_OK)
                goto Fail;
            break;
        case HPDF_PAGE_NUM_STYLE_LOWER_ROMAN:
            if (HPDF_Dict_AddName (obj, "S", "r") != HPDF_OK)
                goto Fail;
            break;
        case HPDF_PAGE_NUM_STYLE_UPPER_LETTERS:
            if (HPDF_Dict_AddName (obj, "S", "A") != HPDF_OK)
                goto Fail;
            break;
        case HPDF_PAGE_NUM_STYLE_LOWER_LETTERS:
            if (HPDF_Dict_AddName (obj, "S", "a") != HPDF_OK)
                goto Fail;
            break;
        default:
            HPDF_SetError (&pdf->error, HPDF_PAGE_NUM_STYLE_OUT_OF_RANGE,
                    (HPDF_STATUS)style);
            goto Fail;
    }

    if (prefix && prefix[0] != 0)
        if (HPDF_Dict_Add (obj, "P", HPDF_String_New (pdf->mmgr, prefix,
                    pdf->def_encoder)) != HPDF_OK)
            goto Fail;

    if (first_page != 0)
        if (HPDF_Dict_AddNumber (obj, "St", first_page) != HPDF_OK)
            goto Fail;

    return obj;

Fail:
    HPDF_Dict_Free (obj);
    return NULL;
}